

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_fexdo_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  CPUMIPSState_conflict5 *pCVar3;
  float16 fVar4;
  int iVar5;
  float32 fVar6;
  int iVar7;
  uint uVar8;
  float_status *pfVar9;
  uintptr_t unaff_retaddr;
  bool local_a9;
  bool local_99;
  int c_3;
  float_status *status_3;
  int c_2;
  float_status *status_2;
  int c_1;
  float_status *status_1;
  int c;
  float_status *status;
  flag ieee;
  uint32_t i;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  wr_t *pwx;
  wr_t wx;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState_conflict5 *env_local;
  
  lVar1 = (ulong)ws * 0x10 + 0x338;
  lVar2 = (ulong)wt * 0x10 + 0x338;
  wx.w[2] = wt;
  wx.w[3] = ws;
  wt_local = wd;
  ws_local = df;
  _wd_local = env;
  clear_msacsr_cause(env);
  if (ws_local == 2) {
    for (status._4_4_ = 0; status._4_4_ < 4; status._4_4_ = status._4_4_ + 1) {
      pfVar9 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar9);
      fVar4 = float16_from_float32
                        (*(int32_t *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 4 + lVar1 + -0x338),
                         '\x01',pfVar9);
      *(float16 *)((long)&wx + (ulong)status._4_4_ * 2) = fVar4;
      iVar7 = update_msacsr(_wd_local,0,0);
      iVar5 = get_enabled_exceptions(_wd_local,iVar7);
      if (iVar5 != 0) {
        fVar4 = float16_default_nan_mips64(pfVar9);
        *(ushort *)((long)&wx + (ulong)status._4_4_ * 2) =
             (ushort)(((int)(fVar4 ^ 0x220) >> 6) << 6) | (ushort)iVar7;
      }
      pfVar9 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar9);
      fVar4 = float16_from_float32
                        (*(int32_t *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 4 + lVar2 + -0x338),
                         '\x01',pfVar9);
      ((wr_t *)&pwx)->h[status._4_4_] = fVar4;
      iVar7 = update_msacsr(_wd_local,0,0);
      iVar5 = get_enabled_exceptions(_wd_local,iVar7);
      if (iVar5 != 0) {
        fVar4 = float16_default_nan_mips64(pfVar9);
        ((wr_t *)&pwx)->h[status._4_4_] = (ushort)(((int)(fVar4 ^ 0x220) >> 6) << 6) | (ushort)iVar7
        ;
      }
    }
  }
  else {
    if (ws_local != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x19bc,
                    "void helper_msa_fexdo_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    for (status._4_4_ = 0; status._4_4_ < 2; status._4_4_ = status._4_4_ + 1) {
      pfVar9 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar9);
      fVar6 = float32_from_float64
                        (*(int64_t *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 8 + lVar1 + -0x338),
                         pfVar9);
      pCVar3 = _wd_local;
      *(float32 *)((long)&wx + (ulong)status._4_4_ * 4) = fVar6;
      iVar7 = float32_is_zero(*(float32 *)((long)&wx + (ulong)status._4_4_ * 4));
      local_99 = false;
      if (iVar7 == 0) {
        iVar7 = float32_is_zero_or_denormal(*(float32 *)((long)&wx + (ulong)status._4_4_ * 4));
        local_99 = iVar7 != 0;
      }
      uVar8 = update_msacsr(pCVar3,0,(uint)local_99);
      iVar7 = get_enabled_exceptions(_wd_local,uVar8);
      if (iVar7 != 0) {
        fVar6 = float32_default_nan_mips64(pfVar9);
        *(float32 *)((long)&wx + (ulong)status._4_4_ * 4) = (fVar6 ^ 0x400020) & 0xffffffc0 | uVar8;
      }
      pfVar9 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar9);
      fVar6 = float32_from_float64
                        (*(int64_t *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 8 + lVar2 + -0x338),
                         pfVar9);
      pCVar3 = _wd_local;
      ((wr_t *)&pwx)->w[status._4_4_] = fVar6;
      iVar7 = float32_is_zero(((wr_t *)&pwx)->w[status._4_4_]);
      local_a9 = false;
      if (iVar7 == 0) {
        iVar7 = float32_is_zero_or_denormal(((wr_t *)&pwx)->w[status._4_4_]);
        local_a9 = iVar7 != 0;
      }
      uVar8 = update_msacsr(pCVar3,0,(uint)local_a9);
      iVar7 = get_enabled_exceptions(_wd_local,uVar8);
      if (iVar7 != 0) {
        fVar6 = float32_default_nan_mips64(pfVar9);
        ((wr_t *)&pwx)->w[status._4_4_] = (fVar6 ^ 0x400020) & 0xffffffc0 | uVar8;
      }
    }
  }
  check_msacsr_cause(_wd_local,unaff_retaddr);
  msa_move_v((wr_t *)((env->active_fpu).fpr + wd),(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_fexdo_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                         uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(Lh(pwx, i), from_float32, pws->w[i], ieee, 16);
            MSA_FLOAT_BINOP(Rh(pwx, i), from_float32, pwt->w[i], ieee, 16);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(Lw(pwx, i), from_float64, pws->d[i], 32);
            MSA_FLOAT_UNOP(Rw(pwx, i), from_float64, pwt->d[i], 32);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}